

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

string * __thiscall
pbrt::FilmHandle::ToString_abi_cxx11_(string *__return_storage_ptr__,FilmHandle *this)

{
  ulong uVar1;
  RGBFilm *this_00;
  allocator<char> local_9;
  
  uVar1 = (this->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits;
  this_00 = (RGBFilm *)(uVar1 & 0xffffffffffff);
  if (this_00 == (RGBFilm *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(nullptr)",&local_9);
  }
  else if (uVar1 >> 0x31 == 0) {
    RGBFilm::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
  }
  else {
    GBufferFilm::ToString_abi_cxx11_(__return_storage_ptr__,(GBufferFilm *)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FilmHandle::ToString() const {
    if (ptr() == nullptr)
        return "(nullptr)";

    auto ts = [&](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(ts);
}